

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O3

int __thiscall jpgd::jpeg_decoder::decode(jpeg_decoder *this,void **pScan_line,uint *pScan_line_len)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint32_t uVar6;
  uint8 *puVar7;
  long lVar8;
  
  if (this->m_error_code != JPGD_SUCCESS) {
    return -1;
  }
  if (this->m_ready_flag != true) {
    return -1;
  }
  iVar5 = this->m_total_lines_left;
  if (iVar5 == 0) {
    return 1;
  }
  if (((this->m_flags & 1) == 0) && (this->m_scan_type - 3U < 2)) {
    if (iVar5 == this->m_image_y_size) {
      bVar3 = false;
      bVar4 = true;
    }
    else {
      bVar1 = false;
      bVar2 = true;
      if ((iVar5 < 2) || (bVar3 = bVar2, bVar4 = true, this->m_mcu_lines_left != 1))
      goto LAB_00151e0b;
    }
LAB_00151df5:
    bVar2 = bVar4;
    bVar1 = bVar3;
    iVar5 = decode_next_mcu_row(this);
    if (iVar5 != 0) {
      return -1;
    }
  }
  else {
    bVar2 = false;
    bVar1 = false;
    bVar3 = bVar2;
    bVar4 = false;
    if (this->m_mcu_lines_left == 0) goto LAB_00151df5;
  }
LAB_00151e0b:
  switch(this->m_scan_type) {
  case 0:
    gray_convert(this);
    break;
  case 1:
    H1V1Convert(this);
    break;
  case 2:
    if ((this->m_flags & 1) == 0) {
      H2V1ConvertFiltered(this);
    }
    else {
      H2V1Convert(this);
    }
    *pScan_line = this->m_pScan_line_0;
    goto switchD_00151e29_default;
  case 3:
    if (bVar2) {
      H1V2ConvertFiltered(this);
      break;
    }
    if ((this->m_mcu_lines_left & 1) == 0) {
      H1V2Convert(this);
      break;
    }
LAB_00151f3a:
    puVar7 = this->m_pScan_line_1;
    goto LAB_00151f0b;
  case 4:
    if ((this->m_flags & 1) == 0) {
      uVar6 = this->m_num_buffered_scanlines;
      if (uVar6 == 1) {
        lVar8 = 0x34c0;
LAB_00151f48:
        *pScan_line = *(void **)((long)this->m_jmp_state[0].__jmpbuf + lVar8);
      }
      else if (uVar6 == 0) {
        uVar6 = H2V2ConvertFiltered(this);
        lVar8 = 0x34b8;
        goto LAB_00151f48;
      }
      this->m_num_buffered_scanlines = uVar6 - 1;
      goto switchD_00151e29_default;
    }
    if ((this->m_mcu_lines_left & 1) != 0) goto LAB_00151f3a;
    H2V2Convert(this);
    break;
  default:
    goto switchD_00151e29_default;
  }
  puVar7 = this->m_pScan_line_0;
LAB_00151f0b:
  *pScan_line = puVar7;
switchD_00151e29_default:
  *pScan_line_len = this->m_real_dest_bytes_per_scan_line;
  if (!bVar1) {
    this->m_mcu_lines_left = this->m_mcu_lines_left + -1;
  }
  this->m_total_lines_left = this->m_total_lines_left + -1;
  return 0;
}

Assistant:

int jpeg_decoder::decode(const void** pScan_line, uint* pScan_line_len)
	{
		if ((m_error_code) || (!m_ready_flag))
			return JPGD_FAILED;

		if (m_total_lines_left == 0)
			return JPGD_DONE;

		const bool chroma_y_filtering = ((m_flags & cFlagBoxChromaFiltering) == 0) && ((m_scan_type == JPGD_YH2V2) || (m_scan_type == JPGD_YH1V2));

		bool get_another_mcu_row = false;
		bool got_mcu_early = false;
		if (chroma_y_filtering)
		{
			if (m_total_lines_left == m_image_y_size)
				get_another_mcu_row = true;
			else if ((m_mcu_lines_left == 1) && (m_total_lines_left > 1))
			{
				get_another_mcu_row = true;
				got_mcu_early = true;
			}
		}
		else
		{
			get_another_mcu_row = (m_mcu_lines_left == 0);
		}

		if (get_another_mcu_row)
		{
			int status = decode_next_mcu_row();
			if (status != 0)
				return status;
		}

		switch (m_scan_type)
		{
		case JPGD_YH2V2:
		{
			if ((m_flags & cFlagBoxChromaFiltering) == 0)
			{
				if (m_num_buffered_scanlines == 1)
				{
					*pScan_line = m_pScan_line_1;
				}
				else if (m_num_buffered_scanlines == 0)
				{
					m_num_buffered_scanlines = H2V2ConvertFiltered();
					*pScan_line = m_pScan_line_0;
				}

				m_num_buffered_scanlines--;
			}
			else
			{
				if ((m_mcu_lines_left & 1) == 0)
				{
					H2V2Convert();
					*pScan_line = m_pScan_line_0;
				}
				else
					*pScan_line = m_pScan_line_1;
			}

			break;
		}
		case JPGD_YH2V1:
		{
			if ((m_flags & cFlagBoxChromaFiltering) == 0)
				H2V1ConvertFiltered();
			else
				H2V1Convert();
			*pScan_line = m_pScan_line_0;
			break;
		}
		case JPGD_YH1V2:
		{
			if (chroma_y_filtering)
			{
				H1V2ConvertFiltered();
				*pScan_line = m_pScan_line_0;
			}
			else
			{
				if ((m_mcu_lines_left & 1) == 0)
				{
					H1V2Convert();
					*pScan_line = m_pScan_line_0;
				}
				else
					*pScan_line = m_pScan_line_1;
			}

			break;
		}
		case JPGD_YH1V1:
		{
			H1V1Convert();
			*pScan_line = m_pScan_line_0;
			break;
		}
		case JPGD_GRAYSCALE:
		{
			gray_convert();
			*pScan_line = m_pScan_line_0;

			break;
		}
		}

		*pScan_line_len = m_real_dest_bytes_per_scan_line;

		if (!got_mcu_early)
		{
			m_mcu_lines_left--;
		}

		m_total_lines_left--;

		return JPGD_SUCCESS;
	}